

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

xchar dname_to_dnum(char *s,boolean optional)

{
  int iVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  
  iVar1 = n_dgns;
  uVar4 = 0;
  while (cVar3 = (char)uVar4, cVar3 < iVar1) {
    iVar2 = strcmp(dungeons[cVar3].dname,s);
    if (iVar2 == 0) goto LAB_00187a04;
    uVar4 = (uint)(byte)(cVar3 + 1);
  }
  uVar4 = iVar1;
  if (optional == '\0') {
    panic("Couldn\'t resolve dungeon number for name \"%s\".",s);
  }
LAB_00187a04:
  return (xchar)uVar4;
}

Assistant:

static xchar dname_to_dnum(const char *s, boolean optional)
{
	xchar	i;

	for (i = 0; i < n_dgns; i++)
	    if (!strcmp(dungeons[i].dname, s)) return i;

	if (optional)
	    return n_dgns;	/* bogus dnum instead of panicking */

	panic("Couldn't resolve dungeon number for name \"%s\".", s);
	/*NOT REACHED*/
	return (xchar)0;
}